

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void pmxevcntr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint8_t in_CL;
  
  pmevcntr_write(env,(ARMCPRegInfo_conflict *)value,(ulong)((uint)(env->cp15).c9_pmselr & 0x1f),
                 in_CL);
  return;
}

Assistant:

static void pmxevcntr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                             uint64_t value)
{
    pmevcntr_write(env, ri, value, env->cp15.c9_pmselr & 31);
}